

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addShaderOperations(GLES2ThreadedSharingTest *this,GLenum type)

{
  EGLThread *pEVar1;
  pointer ppEVar2;
  CreateShader *this_00;
  ShaderSource *pSVar3;
  ShaderCompile *pSVar4;
  DeleteShader *pDVar5;
  char *pcVar6;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *pSVar7;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> shader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_78;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_68;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_38;
  
  shader.m_ptr = (Shader *)0x0;
  shader.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (CreateShader *)operator_new(0x80);
  GLES2ThreadTest::CreateShader::CreateShader
            (this_00,type,&shader,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pSVar3 = (ShaderSource *)operator_new(0x98);
      local_48.m_ptr = shader.m_ptr;
      local_48.m_state = shader.m_state;
      if (shader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pcVar6 = "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}";
      if (type == 0x8b31) {
        pcVar6 = "attribute mediump vec4 a_pos;\nvoid main(void)\n{\n\tgl_Position = a_pos;\n}";
      }
      pSVar7 = &local_48;
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar3,pSVar7,pcVar6,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar3);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (ShaderSource *)operator_new(0x98);
      local_38.m_ptr = shader.m_ptr;
      local_38.m_state = shader.m_state;
      if (shader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pcVar6 = "void main(void)\n{\n\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}";
      if (type == 0x8b31) {
        pcVar6 = "attribute mediump vec4 a_pos;\nvoid main(void)\n{\n\tgl_Position = a_pos;\n}";
      }
      pSVar7 = &local_38;
      GLES2ThreadTest::ShaderSource::ShaderSource
                (pSVar3,pSVar7,pcVar6,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar3);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(pSVar7);
  }
  if ((this->m_config).modify == 0) {
LAB_00dafc89:
    if ((this->m_config).render != true) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pDVar5 = (DeleteShader *)operator_new(0x78);
      local_88.m_ptr = shader.m_ptr;
      local_88.m_state = shader.m_state;
      if (shader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar7 = &local_88;
      GLES2ThreadTest::DeleteShader::DeleteShader
                (pDVar5,pSVar7,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar5);
      goto LAB_00dafd65;
    }
  }
  else {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pSVar4 = (ShaderCompile *)operator_new(0x78);
      local_58.m_ptr = shader.m_ptr;
      local_58.m_state = shader.m_state;
      if (shader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar7 = &local_58;
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar4,pSVar7,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    }
    else {
      pEVar1 = ppEVar2[1];
      pSVar4 = (ShaderCompile *)operator_new(0x78);
      local_68.m_ptr = shader.m_ptr;
      local_68.m_state = shader.m_state;
      if (shader.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar7 = &local_68;
      GLES2ThreadTest::ShaderCompile::ShaderCompile
                (pSVar4,pSVar7,(this->m_config).useFenceSync,(this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(pSVar7);
    if ((this->m_config).modify == 0) goto LAB_00dafc89;
  }
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar5 = (DeleteShader *)operator_new(0x78);
  local_78.m_ptr = shader.m_ptr;
  local_78.m_state = shader.m_state;
  if (shader.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (shader.m_state)->strongRefCount = (shader.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (shader.m_state)->weakRefCount = (shader.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  pSVar7 = &local_78;
  GLES2ThreadTest::DeleteShader::DeleteShader
            (pDVar5,pSVar7,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar5);
LAB_00dafd65:
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(pSVar7);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&shader);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addShaderOperations (GLenum type)
{
	SharedPtr<GLES2ThreadTest::Shader> shader;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(type, shader, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		const char* vertexShaderSource =
		"attribute mediump vec4 a_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_Position = a_pos;\n"
		"}";

		const char* fragmentShaderSource =
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
		"}";

		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderSource(shader, (type == GL_VERTEX_SHADER ? vertexShaderSource : fragmentShaderSource), m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::ShaderCompile(shader, m_config.useFenceSync, m_config.serverSync));
	}

	DE_ASSERT(!m_config.render);

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteShader(shader, m_config.useFenceSync, m_config.serverSync));
}